

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxMemberFunctionCall::FxMemberFunctionCall
          (FxMemberFunctionCall *this,FxExpression *self,FName *methodname,FArgumentList *args,
          FScriptPosition *pos)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_MemberFunctionCall;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMemberFunctionCall_00710a68;
  (this->MethodName).Index = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression **)0x0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Most = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count = 0;
  this->Self = self;
  (this->MethodName).Index = methodname->Index;
  TArray<FxExpression_*,_FxExpression_*>::operator=
            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
             &args->super_TArray<FxExpression_*,_FxExpression_*>);
  return;
}

Assistant:

FxMemberFunctionCall::FxMemberFunctionCall(FxExpression *self, FName methodname, FArgumentList &args, const FScriptPosition &pos)
	: FxExpression(EFX_MemberFunctionCall, pos)
{
	Self = self;
	MethodName = methodname;
	ArgList = std::move(args);
}